

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O1

unique_ptr<Imonitor,_std::default_delete<Imonitor>_> __thiscall
registry::Registry<Imonitor>::create<>(Registry<Imonitor> *this,string *class_name)

{
  int iVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
  *this_00;
  const_iterator cVar2;
  map_t *this_01;
  _Any_data *p_Var3;
  Imonitor *pIVar4;
  long *plVar5;
  string *psVar6;
  string *local_78;
  string local_68;
  undefined8 local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &ctors_abi_cxx11_()->_M_t;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
          ::find(this_00,class_name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
    std::operator+(&local_38,"Registry: class ",class_name);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_38);
    class_name = &local_68;
    local_78 = (string *)*plVar5;
    psVar6 = (string *)(plVar5 + 2);
    if (local_78 == psVar6) {
      local_68._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
      local_68._M_string_length._0_4_ = (undefined4)plVar5[3];
      local_68._M_string_length._4_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
      local_78 = class_name;
    }
    else {
      local_68._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
    }
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (spdlog::details::registry::instance()::s_instance == '\0') goto LAB_00152832;
  }
  else {
    this_01 = ctors_abi_cxx11_();
    p_Var3 = (_Any_data *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Imonitor_*()>_>_>_>
             ::operator[](this_01,class_name);
    if (*(long *)(p_Var3 + 1) != 0) {
      pIVar4 = (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3);
      goto LAB_0015281a;
    }
    std::__throw_bad_function_call();
LAB_00152832:
    iVar1 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
    if (iVar1 != 0) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
  }
  local_68.field_2._M_allocated_capacity = 0;
  local_68.field_2._8_8_ = 0;
  local_48 = 0;
  spdlog::logger::log((logger *)spdlog::details::registry::instance()::s_instance._304_8_,0.0);
  if (local_78 != class_name) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  *(undefined8 *)this = 0;
  pIVar4 = (Imonitor *)0x0;
LAB_0015281a:
  *(Imonitor **)this = pIVar4;
  return (__uniq_ptr_data<Imonitor,_std::default_delete<Imonitor>,_true,_true>)
         (__uniq_ptr_data<Imonitor,_std::default_delete<Imonitor>,_true,_true>)this;
}

Assistant:

static std::unique_ptr<T> create(const std::string& class_name,
                                   Args&&... pack) {
    if (ctors().count(class_name) == 1) {
      return std::unique_ptr<T>(
          ctors()[class_name](std::forward<Args>(pack)...));
    }
    spdlog::error("Registry: class " + class_name + " is not registered.");
    return std::unique_ptr<T>(nullptr);
  }